

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O0

int __thiscall wabt::WastLexer::ReadReservedChars(WastLexer *this)

{
  bool bVar1;
  int c;
  undefined4 local_14;
  int count;
  WastLexer *this_local;
  
  local_14 = 0;
  while( true ) {
    c = PeekChar(this);
    bVar1 = IsReserved(c);
    if (!bVar1) break;
    ReadChar(this);
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

int WastLexer::ReadReservedChars() {
  int count = 0;
  while (IsReserved(PeekChar())) {
    ReadChar();
    ++count;
  }
  return count;
}